

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O2

bool __thiscall cmCommandArgument::MayFollow(cmCommandArgument *this,cmCommandArgument *current)

{
  const_iterator cVar1;
  bool bVar2;
  cmCommandArgument *local_10;
  
  bVar2 = true;
  if (this->ArgumentsBeforeEmpty == false) {
    local_10 = current;
    cVar1 = std::
            _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
            ::find(&(this->ArgumentsBefore)._M_t,&local_10);
    bVar2 = (_Rb_tree_header *)cVar1._M_node !=
            &(this->ArgumentsBefore)._M_t._M_impl.super__Rb_tree_header;
  }
  return bVar2;
}

Assistant:

bool cmCommandArgument::MayFollow(const cmCommandArgument* current) const
{
  if (this->ArgumentsBeforeEmpty) {
    return true;
  }
  return this->ArgumentsBefore.find(current) != this->ArgumentsBefore.end();
}